

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::LoopNode::Print(LoopNode *this,DebugWriter *w,Char *litbuf)

{
  char16_t *pcVar1;
  
  DebugWriter::Print(w,L"Loop(");
  CountDomain::Print(&this->repeats,w);
  pcVar1 = L"non-greedy";
  if (this->isGreedy != false) {
    pcVar1 = L"greedy";
  }
  DebugWriter::PrintEOL(w,L", %s)",pcVar1);
  Node::PrintAnnotations(&this->super_Node,w);
  DebugWriter::PrintEOL(w,L"{");
  DebugWriter::Indent(w);
  (*this->body->_vptr_Node[0x16])(this->body,w,litbuf);
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void LoopNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->Print(_u("Loop("));
        repeats.Print(w);
        w->PrintEOL(_u(", %s)"), isGreedy ? _u("greedy") : _u("non-greedy"));
        PrintAnnotations(w);
        w->PrintEOL(_u("{"));
        w->Indent();
        body->Print(w, litbuf);
        w->Unindent();
        w->PrintEOL(_u("}"));
    }